

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_nls.c
# Opt level: O0

int arkStep_NlsFPFunction_MassIdent_TrivialPredAutonomous(N_Vector zcor,N_Vector g,void *arkode_mem)

{
  int iVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int nls_iter;
  int retval;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = arkStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (ARKodeARKStepMem *)0x12544e);
  if (local_4 == 0) {
    N_VLinearSum(0x3ff0000000000000,*(undefined8 *)(in_stack_ffffffffffffffd0 + 0x50),in_RDI,
                 *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x248));
    iVar1 = SUNNonlinSolGetCurIter
                      (*(undefined8 *)(in_stack_ffffffffffffffd0 + 0x88),&stack0xffffffffffffffc8);
    if (iVar1 == 0) {
      if ((in_stack_ffffffffffffffc8 == 0) && (*(long *)(in_stack_ffffffffffffffd0 + 0x118) != 0)) {
        N_VScale(0x3ff0000000000000,*(undefined8 *)(in_stack_ffffffffffffffd0 + 0x118),
                 *(undefined8 *)
                  (*(long *)(in_stack_ffffffffffffffd0 + 0x38) +
                  (long)*(int *)(in_stack_ffffffffffffffd0 + 0x68) * 8));
      }
      else {
        iVar1 = (**(code **)(in_stack_ffffffffffffffd0 + 0x98))
                          (*(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x2f0),
                           *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x248),
                           *(undefined8 *)
                            (*(long *)(in_stack_ffffffffffffffd0 + 0x38) +
                            (long)*(int *)(in_stack_ffffffffffffffd0 + 0x68) * 8),
                           *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0x10));
        *(long *)(in_stack_ffffffffffffffd0 + 400) = *(long *)(in_stack_ffffffffffffffd0 + 400) + 1;
        if (iVar1 < 0) {
          return -8;
        }
        if (0 < iVar1) {
          return 9;
        }
      }
      N_VLinearSum(*(undefined8 *)(in_stack_ffffffffffffffd0 + 0xa0),0x3ff0000000000000,
                   *(undefined8 *)
                    (*(long *)(in_stack_ffffffffffffffd0 + 0x38) +
                    (long)*(int *)(in_stack_ffffffffffffffd0 + 0x68) * 8),
                   *(undefined8 *)(in_stack_ffffffffffffffd0 + 0x48),in_RSI);
      local_4 = 0;
    }
    else {
      local_4 = -0x20;
    }
  }
  return local_4;
}

Assistant:

int arkStep_NlsFPFunction_MassIdent_TrivialPredAutonomous(N_Vector zcor,
                                                          N_Vector g,
                                                          void* arkode_mem)
{
  /* temporary variables */
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  int retval, nls_iter;

  /* access ARKodeMem and ARKodeARKStepMem structures */
  retval = arkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* update 'ycur' value as stored predictor + current corrector */
  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, ark_mem->ycur);

  /* compute implicit RHS if not already available */
  retval = SUNNonlinSolGetCurIter(step_mem->NLS, &nls_iter);
  if (retval != ARK_SUCCESS) { return ARK_NLS_OP_ERR; }

  if (nls_iter == 0 && step_mem->fn_implicit)
  {
    N_VScale(ONE, step_mem->fn_implicit, step_mem->Fi[step_mem->istage]);
  }
  else
  {
    /* compute implicit RHS and save for later */
    retval = step_mem->nls_fi(ark_mem->tcur, ark_mem->ycur,
                              step_mem->Fi[step_mem->istage], ark_mem->user_data);
    step_mem->nfi++;
    if (retval < 0) { return (ARK_RHSFUNC_FAIL); }
    if (retval > 0) { return (RHSFUNC_RECVR); }
  }

  /* combine parts:  g = gamma*Fi(z) + sdata */
  N_VLinearSum(step_mem->gamma, step_mem->Fi[step_mem->istage], ONE,
               step_mem->sdata, g);

  return (ARK_SUCCESS);
}